

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

int AF_DBlockThingsIterator_Create
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  VMValue *pVVar2;
  DBlockThingsIterator *this;
  PClass *pPVar3;
  bool bVar4;
  bool local_71;
  AActor *local_70;
  DBlockThingsIterator *state;
  double dStack_48;
  bool ignore;
  double radius;
  AActor *origin;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4b8,
                  "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    pPVar3 = (PClass *)defaultparam;
    if ((param->field_0).field_1.a == (void *)0x0) {
      NullParam("\"origin\"");
      local_70 = (AActor *)(param->field_0).field_1.a;
    }
    else {
      local_70 = (AActor *)(param->field_0).field_1.a;
    }
    local_71 = true;
    if (local_70 != (AActor *)0x0) {
      pPVar3 = AActor::RegistrationInfo.MyClass;
      local_71 = DObject::IsKindOf((DObject *)local_70,AActor::RegistrationInfo.MyClass);
    }
    if (local_71 != false) {
      if (numparam < 2) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar2->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4b9,
                        "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pPVar3 = (PClass *)0x1;
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        dStack_48 = (pVVar2->field_0).f;
      }
      else {
        if (param[1].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4b9,
                        "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        dStack_48 = param[1].field_0.f;
      }
      if (numparam < 3) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4ba,
                        "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pPVar3 = (PClass *)0x2;
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        iVar1 = (pVVar2->field_0).i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4ba,
                        "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[2].field_0.i;
      }
      state._7_1_ = iVar1 != 0;
      this = (DBlockThingsIterator *)DObject::operator_new((DObject *)0x218,(size_t)pPVar3);
      DBlockThingsIterator::DBlockThingsIterator(this,local_70,dStack_48,state._7_1_);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4bb,
                        "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,this,1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("origin == NULL || origin->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4b8,
                  "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x4b8,
                "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, Create)
{
	PARAM_PROLOGUE;
	PARAM_OBJECT_NOT_NULL(origin, AActor);
	PARAM_FLOAT_DEF(radius);
	PARAM_BOOL_DEF(ignore);
	ACTION_RETURN_OBJECT(new DBlockThingsIterator(origin, radius, ignore));
}